

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QRhiShaderStage,unsigned_int>::emplace<unsigned_int_const&>
          (QHash<QRhiShaderStage,unsigned_int> *this,QRhiShaderStage *key,uint *args)

{
  Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QHash<QRhiShaderStage,_unsigned_int> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> **)this;
  if (pDVar1 == (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)0x0) {
    local_28.d = (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)0x0;
LAB_0057ac83:
    pDVar1 = (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)0x0;
LAB_0057aca4:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_>::detached
                       (pDVar1);
    *(Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> **)this = pDVar1;
  }
  else {
    if ((uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i < 2) {
      if (pDVar1->size < pDVar1->numBuckets >> 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar2 = (piter)emplace_helper<unsigned_int_const&>(this,key,args);
          return (iterator)pVar2;
        }
      }
      else {
        local_28.d._0_4_ = *args;
        pVar2 = (piter)QHash<QRhiShaderStage,_unsigned_int>::emplace_helper<unsigned_int>
                                 ((QHash<QRhiShaderStage,_unsigned_int> *)this,key,(uint *)&local_28
                                 );
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar2;
        }
      }
      goto LAB_0057ad0b;
    }
    local_28.d = pDVar1;
    if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
      LOCK();
      (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pDVar1 = *(Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> **)this;
      if (pDVar1 == (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)0x0)
      goto LAB_0057ac83;
    }
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_0057aca4;
  }
  pVar2 = (piter)emplace_helper<unsigned_int_const&>(this,key,args);
  QHash<QRhiShaderStage,_unsigned_int>::~QHash(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
LAB_0057ad0b:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }